

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::MaxId>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConvertWithExpressions<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
                 *con,int i,ConstraintAcceptanceLevel param_4,ExpressionAcceptanceLevel eal)

{
  bool bVar1;
  ConType *this_00;
  QuadAndLinTerms *in_RDI;
  int in_R8D;
  int unaff_retaddr;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
  *in_stack_00000008;
  undefined4 in_stack_00000010;
  int in_stack_00000054;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
  *in_stack_00000058;
  Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_00000060;
  int in_stack_00000884;
  ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
  *in_stack_00000888;
  Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_00000890;
  
  if (in_R8D != 0) {
    if (*(int *)((in_RDI->super_LinTerms).coefs_.super_small_vector_base<std::allocator<double>,_6U>
                 .m_data.m_storage.m_data + 5) == 1) {
      HandleLogicalArgs<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>>
                ((Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *)CONCAT44(eal,in_stack_00000010),in_stack_00000008,unaff_retaddr);
      this_00 = ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>_>
                ::GetConstraint((ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
                                 *)0x26e0d9);
      AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<-1>_>::GetBody(this_00);
      bVar1 = QuadAndLinTerms::is_variable(in_RDI);
      if (!bVar1) {
        ConvertConditionalConLHS<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>
                  (in_stack_00000890,in_stack_00000888,in_stack_00000884);
        return true;
      }
    }
    else {
      Constraints2Expr<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::MaxId>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
      ::
      ConsiderExplicifyingExpression<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>,_true>
                (in_stack_00000060,in_stack_00000058,in_stack_00000054);
    }
  }
  return false;
}

Assistant:

bool ConvertWithExpressions(
      const ConditionalConstraint< AlgebraicConstraint<Body, RhsOrRange> >& con,
      int i,
      ConstraintAcceptanceLevel , ExpressionAcceptanceLevel eal) {
    assert(stage_cvt2expr_>0 && stage_cvt2expr_<=2);
    assert(!con.GetContext().IsNone());
    // See if the item is going into an expr.
    // Otherwise it's a flat con.
    if (ExpressionAcceptanceLevel::NotAccepted != eal) {
      if (1==stage_cvt2expr_) {
        HandleLogicalArgs(con, i);         // expicify logical args
        if (!con.GetConstraint().GetBody().is_variable()) {  // already a variable
          ConvertConditionalConLHS(con, i);
          return true;
        }
      }
      else   // if (2==stage_cvt2expr_)
        ConsiderExplicifyingExpression(con, i);        // this is a func con too
    }
    return false;
  }